

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgt.c
# Opt level: O3

opj_tgt_tree_t * tgt_create_v2(OPJ_UINT32 numleafsh,OPJ_UINT32 numleafsv)

{
  opj_tgt_node *poVar1;
  OPJ_UINT32 OVar2;
  opj_tgt_tree_t *poVar3;
  opj_tgt_node_t *poVar4;
  OPJ_UINT32 *pOVar5;
  OPJ_UINT32 OVar6;
  ulong uVar7;
  int iVar8;
  opj_tgt_node_t *poVar9;
  opj_tgt_node *poVar10;
  opj_tgt_node *poVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  OPJ_INT32 nplv [32];
  OPJ_INT32 nplh [32];
  OPJ_UINT32 local_138 [32];
  OPJ_UINT32 local_b8 [34];
  
  poVar3 = (opj_tgt_tree_t *)calloc(1,0x20);
  if (poVar3 == (opj_tgt_tree_t *)0x0) {
    tgt_create_v2_cold_3();
  }
  else {
    poVar3->numleafsh = numleafsh;
    poVar3->numleafsv = numleafsv;
    uVar13 = 0xffffffff;
    OVar2 = numleafsv;
    uVar14 = 0;
    local_b8[0] = numleafsh;
    OVar6 = numleafsh;
    do {
      uVar15 = uVar14;
      uVar12 = OVar2 * OVar6;
      OVar6 = (int)((OVar6 - ((int)(OVar6 + 1) >> 0x1f)) + 1) >> 1;
      local_b8[uVar13 + 2] = OVar6;
      OVar2 = (int)((OVar2 - ((int)(OVar2 + 1) >> 0x1f)) + 1) >> 1;
      local_138[uVar13 + 2] = OVar2;
      uVar14 = uVar15 + uVar12;
      uVar13 = uVar13 + 1;
    } while (1 < uVar12);
    poVar3->numnodes = uVar14;
    local_138[0] = numleafsv;
    if (uVar14 == 0) {
      tgt_create_v2_cold_2();
    }
    else {
      poVar4 = (opj_tgt_node_t *)calloc((ulong)uVar14,0x18);
      poVar3->nodes = poVar4;
      if (poVar4 != (opj_tgt_node_t *)0x0) {
        poVar3->nodes_size = uVar14 * 0x18;
        poVar9 = poVar4;
        if (uVar13 != 0) {
          poVar10 = poVar4 + numleafsv * numleafsh;
          uVar7 = 0;
          poVar11 = poVar10;
          do {
            OVar2 = local_138[uVar7];
            if (0 < (int)OVar2) {
              OVar6 = local_b8[uVar7];
              uVar14 = 0;
              do {
                uVar16 = OVar6 + 2;
                if (0 < (int)OVar6) {
                  do {
                    poVar9->parent = poVar11;
                    if (uVar16 == 3) {
                      poVar11 = poVar11 + 1;
                      poVar9 = poVar9 + 1;
                      break;
                    }
                    poVar9[1].parent = poVar11;
                    poVar9 = poVar9 + 2;
                    poVar11 = poVar11 + 1;
                    uVar16 = uVar16 - 2;
                  } while (2 < uVar16);
                }
                poVar1 = poVar10 + (int)OVar6;
                if (uVar14 == OVar2 - 1 || (uVar14 & 1) != 0) {
                  poVar1 = poVar11;
                  poVar10 = poVar11;
                }
                poVar11 = poVar10;
                poVar10 = poVar1;
                uVar14 = uVar14 + 1;
              } while (uVar14 != OVar2);
            }
            uVar7 = uVar7 + 1;
          } while (uVar7 != uVar13);
        }
        poVar9->parent = (opj_tgt_node *)0x0;
        pOVar5 = &poVar4->known;
        iVar8 = uVar15 + uVar12;
        do {
          *(undefined8 *)(pOVar5 + -2) = 999;
          *pOVar5 = 0;
          pOVar5 = pOVar5 + 6;
          iVar8 = iVar8 + -1;
        } while (iVar8 != 0);
        return poVar3;
      }
      tgt_create_v2_cold_1();
    }
  }
  return (opj_tgt_tree_t *)0x0;
}

Assistant:

opj_tgt_tree_t *tgt_create_v2(OPJ_UINT32 numleafsh, OPJ_UINT32 numleafsv) {
	OPJ_INT32 nplh[32];
	OPJ_INT32 nplv[32];
	opj_tgt_node_t *node = 00;
	opj_tgt_node_t *l_parent_node = 00;
	opj_tgt_node_t *l_parent_node0 = 00;
	opj_tgt_tree_t *tree = 00;
	OPJ_UINT32 i;
	OPJ_INT32  j,k;
	OPJ_UINT32 numlvls;
	OPJ_UINT32 n;

	tree = (opj_tgt_tree_t *) opj_malloc(sizeof(opj_tgt_tree_t));
	if(!tree) {
		fprintf(stderr, "ERROR in tgt_create_v2 while allocating tree\n");
		return 00;
	}
	memset(tree,0,sizeof(opj_tgt_tree_t));

	tree->numleafsh = numleafsh;
	tree->numleafsv = numleafsv;

	numlvls = 0;
	nplh[0] = numleafsh;
	nplv[0] = numleafsv;
	tree->numnodes = 0;
	do {
		n = nplh[numlvls] * nplv[numlvls];
		nplh[numlvls + 1] = (nplh[numlvls] + 1) / 2;
		nplv[numlvls + 1] = (nplv[numlvls] + 1) / 2;
		tree->numnodes += n;
		++numlvls;
	} while (n > 1);

	/* ADD */
	if (tree->numnodes == 0) {
		opj_free(tree);
		fprintf(stderr, "WARNING in tgt_create_v2 tree->numnodes == 0, no tree created.\n");
		return 00;
	}

	tree->nodes = (opj_tgt_node_t*) opj_calloc(tree->numnodes, sizeof(opj_tgt_node_t));
	if(!tree->nodes) {
		fprintf(stderr, "ERROR in tgt_create_v2 while allocating node of the tree\n");
		opj_free(tree);
		return 00;
	}
	memset(tree->nodes,0,tree->numnodes * sizeof(opj_tgt_node_t));
	tree->nodes_size = tree->numnodes * sizeof(opj_tgt_node_t);

	node = tree->nodes;
	l_parent_node = &tree->nodes[tree->numleafsh * tree->numleafsv];
	l_parent_node0 = l_parent_node;

	for (i = 0; i < numlvls - 1; ++i) {
		for (j = 0; j < nplv[i]; ++j) {
			k = nplh[i];
			while (--k >= 0) {
				node->parent = l_parent_node;
				++node;
				if (--k >= 0) {
					node->parent = l_parent_node;
					++node;
				}
				++l_parent_node;
			}
			if ((j & 1) || j == nplv[i] - 1) {
				l_parent_node0 = l_parent_node;
			} else {
				l_parent_node = l_parent_node0;
				l_parent_node0 += nplh[i];
			}
		}
	}
	node->parent = 0;
	tgt_reset(tree);
	return tree;
}